

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void deserialize_model<_IO_FILE*,short,unsigned_int>
               (IsoForest *model,_IO_FILE **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian,bool lacks_range_penalty,bool lacks_scoring_metric)

{
  ushort uVar1;
  ScoringMetric SVar2;
  IsoTree *pIVar3;
  IsoTree *node;
  IsoTree *node_00;
  vector<IsoTree,_std::allocator<IsoTree>_> *tree;
  pointer this;
  ulong uVar4;
  double data_doubles [2];
  size_t veclen;
  size_t data_sizets [2];
  byte local_68;
  undefined1 uStack_67;
  byte bStack_66;
  char cStack_65;
  undefined4 uStack_64;
  double dStack_60;
  pointer local_58;
  size_type local_50;
  size_t local_48;
  size_type local_40;
  
  if (!interrupt_switch) {
    if (lacks_range_penalty) {
      read_bytes<unsigned_char>(&local_68,3,in);
      uVar1 = CONCAT11(uStack_67,local_68);
    }
    else {
      read_bytes<unsigned_char>(&local_68,4,in);
      uVar1 = CONCAT11(uStack_67,local_68);
      model->has_range_penalty = cStack_65 != '\0';
    }
    uVar4 = (ulong)CONCAT14((char)(uVar1 >> 8),(uint)(uVar1 & 0xff));
    model->new_cat_action = (int)uVar4;
    model->cat_split_type = (int)(uVar4 >> 0x20);
    model->missing_action = (uint)bStack_66;
    SVar2 = Depth;
    if (!lacks_scoring_metric) {
      read_bytes<unsigned_char>(&local_68,1,in);
      SVar2 = (ScoringMetric)local_68;
    }
    model->scoring_metric = SVar2;
    read_bytes<double>(&local_68,2,in);
    if (diff_endian) {
      swap_endianness<double>((double *)&local_68,2);
    }
    model->exp_avg_depth =
         (double)CONCAT44(uStack_64,
                          CONCAT13(cStack_65,CONCAT12(bStack_66,CONCAT11(uStack_67,local_68))));
    model->exp_avg_sep = dStack_60;
    read_bytes<unsigned_long,unsigned_int>(&local_48,2,in,buffer,diff_endian);
    model->orig_sample_size = local_48;
    std::
    vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
    ::resize(&model->trees,local_40);
    local_58 = (model->trees).
               super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (local_58 !=
        (model->trees).
        super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      __shrink_to_fit_aux<std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>,_true>
      ::_S_do_it(&model->trees);
      local_58 = (model->trees).
                 super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    }
    this = (model->trees).
           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    if (this != local_58) {
      do {
        read_bytes<unsigned_long,unsigned_int>(&local_50,1,in,buffer,diff_endian);
        std::vector<IsoTree,_std::allocator<IsoTree>_>::resize(this,local_50);
        pIVar3 = (this->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (pIVar3 != (this->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
          std::__shrink_to_fit_aux<std::vector<IsoTree,_std::allocator<IsoTree>_>,_true>::_S_do_it
                    (this);
          pIVar3 = (this->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        for (node_00 = (this->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                       super__Vector_impl_data._M_start; node_00 != pIVar3; node_00 = node_00 + 1) {
          deserialize_node<_IO_FILE*,short,unsigned_int>(node_00,in,buffer,diff_endian);
        }
        this = this + 1;
      } while (this != local_58);
    }
  }
  return;
}

Assistant:

void deserialize_model(IsoForest &model, itype &in, std::vector<char> &buffer,
                       const bool diff_endian, const bool lacks_range_penalty,
                       const bool lacks_scoring_metric)
{
    if (interrupt_switch) return;

    if (lacks_range_penalty)
    {
        uint8_t data_en[3];
        read_bytes<uint8_t>((void*)data_en, (size_t)3, in);
        model.new_cat_action = (NewCategAction)data_en[0];
        model.cat_split_type = (CategSplit)data_en[1];
        model.missing_action = (MissingAction)data_en[2];
    }

    else
    {
        uint8_t data_en[4];
        read_bytes<uint8_t>((void*)data_en, (size_t)4, in);
        model.new_cat_action = (NewCategAction)data_en[0];
        model.cat_split_type = (CategSplit)data_en[1];
        model.missing_action = (MissingAction)data_en[2];
        model.has_range_penalty = (bool)data_en[3];
    }

    if (lacks_scoring_metric)
    {
        model.scoring_metric = Depth;
    }

    else
    {
        uint8_t data_en;
        read_bytes<uint8_t>((void*)&data_en, (size_t)1, in);
        model.scoring_metric = (ScoringMetric)data_en;
    }

    double data_doubles[2];
    read_bytes<double, double>((void*)data_doubles, (size_t)2, in, buffer, diff_endian);
    model.exp_avg_depth = data_doubles[0];
    model.exp_avg_sep = data_doubles[1];

    size_t data_sizets[2];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)2, in, buffer, diff_endian);
    model.orig_sample_size = data_sizets[0];
    model.trees.resize(data_sizets[1]);
    model.trees.shrink_to_fit();

    size_t veclen;
    for (auto &tree : model.trees) {
        read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer, diff_endian);
        tree.resize(veclen);
        tree.shrink_to_fit();
        for (auto &node : tree)
            deserialize_node<itype, saved_int_t, saved_size_t>(node, in, buffer, diff_endian);
    }
}